

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O3

Vec_Int_t *
Gia_ManInseTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  int iVar1;
  Vec_Int_t *vInit0_00;
  int *__ptr;
  Vec_Int_t *pVVar2;
  
  vInit0_00 = (Vec_Int_t *)calloc(1,0x10);
  iVar1 = p->nRegs;
  if ((long)iVar1 < 1) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)calloc(1,(long)iVar1 << 2);
    vInit0_00->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vInit0_00->nCap = iVar1;
  }
  vInit0_00->nSize = iVar1;
  pVVar2 = Gia_ManInsePerform(p,vInit0_00,nFrames,nWords,fVerbose);
  if (vInit0_00 != vInit0) {
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    free(vInit0_00);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_ManInseTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 0 );
    vRes = Gia_ManInsePerform( p, vInit, nFrames, nWords, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}